

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

void __thiscall Matrix<double>::add_row(Matrix<double> *this,uint n_row)

{
  bool bVar1;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  (this->m_shape).n_row = (this->m_shape).n_row + n_row;
  while (bVar1 = n_row != 0, n_row = n_row - 1, bVar1) {
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&this->m_elems,(vector<double,_std::allocator<double>_> *)&local_38);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  }
  return;
}

Assistant:

void Matrix<T>::add_row(unsigned n_row){
    m_shape.n_row+=n_row;
    for(unsigned i=0;i<n_row;++i)
        m_elems.push_back(std::vector<T>());
}